

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O2

void __thiscall AdaptorSignature_Decrypt_Test::TestBody(AdaptorSignature_Decrypt_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  string local_78;
  string local_58;
  ByteData normalized_compact_sig;
  ByteData sig;
  
  cfd::core::AdaptorSignature::Decrypt(&sig,&adaptor_sig2,&secret);
  cfd::core::CryptoUtil::NormalizeSignature(&normalized_compact_sig,&compact_sig);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_58,&normalized_compact_sig);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_78,&sig);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"normalized_compact_sig.GetHex()","sig.GetHex()",&local_58,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x33,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&normalized_compact_sig)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  return;
}

Assistant:

TEST(AdaptorSignature, Decrypt) {
  auto sig = adaptor_sig2.Decrypt(secret);

  auto normalized_compact_sig = CryptoUtil::NormalizeSignature(compact_sig);
  EXPECT_EQ(normalized_compact_sig.GetHex(), sig.GetHex());
}